

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall
xray_re::xr_bone::calculate_motion(xr_bone *this,xr_skl_motion *sm,fmatrix *parent_xform)

{
  byte bVar1;
  bool bVar2;
  _matrix<float> *a;
  reference ppxVar3;
  __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
  local_78;
  xr_bone_vec_it end;
  xr_bone_vec_it it;
  uint8_t flags;
  fmatrix *parent_xform_local;
  xr_skl_motion *sm_local;
  xr_bone *this_local;
  
  bVar1 = xr_skl_motion::bone_motion_flags(sm,this->m_id);
  if ((bVar1 & 1) == 0) {
    _matrix<float>::set_xyz_i(&this->m_mot_xform,&this->m_mot_rotate);
    _vector3<float>::set<float>(&(this->m_mot_xform).field_0.field_1.c,&this->m_mot_offset);
    _matrix<float>::mul(&this->m_last_xform,parent_xform,&this->m_mot_xform);
  }
  else {
    _matrix<float>::set_xyz_i(&this->m_mot_xform,&this->m_mot_rotate);
    _vector3<float>::set<float>(&(this->m_mot_xform).field_0.field_1.c,&this->m_mot_offset);
    _matrix<float>::mul(&this->m_last_xform,parent_xform,&this->m_mot_xform);
    _vector3<float>::set<float>
              ((_vector3<float> *)&this->m_last_xform,(_vector3<float> *)&this->m_mot_xform);
    _vector3<float>::set<float>
              (&(this->m_last_xform).field_0.field_1.j,&(this->m_mot_xform).field_0.field_1.j);
    _vector3<float>::set<float>
              (&(this->m_last_xform).field_0.field_1.k,&(this->m_mot_xform).field_0.field_1.k);
    memset((void *)((long)&it._M_current + 4),0,0x40);
    a = _matrix<float>::invert_43((_matrix<float> *)((long)&it._M_current + 4),parent_xform);
    _matrix<float>::mul_a_43(&this->m_mot_xform,a);
  }
  _matrix<float>::mul_43(&this->m_render_xform,&this->m_last_xform,&this->m_bind_i_xform);
  end._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::begin
                 (&this->m_children);
  local_78._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::end(&this->m_children);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&end,&local_78);
    if (!bVar2) break;
    ppxVar3 = __gnu_cxx::
              __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
              ::operator*(&end);
    calculate_motion(*ppxVar3,sm,&this->m_last_xform);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

void xr_bone::calculate_motion(xr_skl_motion* sm, const fmatrix& parent_xform)
{
	uint8_t flags = sm->bone_motion_flags(m_id);
	if (flags & xr_bone_motion::BMF_WORLD_ORIENT) {
		m_mot_xform.set_xyz_i(m_mot_rotate);
		m_mot_xform.c.set(m_mot_offset);
		m_last_xform.mul(parent_xform, m_mot_xform);

		m_last_xform.i.set(m_mot_xform.i);
		m_last_xform.j.set(m_mot_xform.j);
		m_last_xform.k.set(m_mot_xform.k);

		m_mot_xform.mul_a_43(fmatrix().invert_43(parent_xform));
	} else {
		m_mot_xform.set_xyz_i(m_mot_rotate);
		m_mot_xform.c.set(m_mot_offset);
		m_last_xform.mul(parent_xform, m_mot_xform);
	}
	m_render_xform.mul_43(m_last_xform, m_bind_i_xform);
	for (xr_bone_vec_it it = m_children.begin(), end = m_children.end(); it != end; ++it)
		(*it)->calculate_motion(sm, m_last_xform);
}